

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManRefinePrintPPis(Ga2_Man_t *p)

{
  int Entry;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  size_t __nmemb;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  pVVar4 = p->vValues;
  if (0 < pVVar4->nSize) {
    lVar9 = 0;
    do {
      Entry = pVVar4->pArray[lVar9];
      lVar8 = (long)Entry;
      if (lVar8 < 0) goto LAB_005f7390;
      iVar1 = p->pGia->nObjs;
      if (iVar1 <= Entry) goto LAB_005f7390;
      pGVar2 = p->pGia->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (lVar9 != 0) {
        if (iVar1 <= Entry) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->vIds->nSize <= Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = p->vIds->pArray[lVar8];
        if (-1 < (int)uVar5) {
          if (p->vCnfs->nSize <= (int)(uVar5 * 2)) goto LAB_005f73af;
          if (p->vCnfs->pArray[(ulong)uVar5 * 2] != (void *)0x0) goto LAB_005f72e0;
        }
        lVar8 = *(long *)(pGVar2 + lVar8);
        if (-1 < lVar8) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d1,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        if ((int)uVar5 < 0) {
LAB_005f73ce:
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d2,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        if (p->vCnfs->nSize <= (int)(uVar5 * 2)) {
LAB_005f73af:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vCnfs->pArray[(ulong)uVar5 * 2] != (void *)0x0) goto LAB_005f73ce;
        uVar5 = (uint)lVar8;
        uVar6 = ~uVar5;
        if (((uVar6 & 0x9fffffff) != 0) && ((int)uVar5 < 0 || (uVar6 & 0x1fffffff) == 0)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d3,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        Vec_IntPush(p_00,Entry);
      }
LAB_005f72e0:
      lVar9 = lVar9 + 1;
      pVVar4 = p->vValues;
    } while (lVar9 < pVVar4->nSize);
  }
  __nmemb = (size_t)p_00->nSize;
  printf("        Current PPIs (%d): ",(ulong)(uint)p_00->nSize);
  piVar3 = p_00->pArray;
  qsort(piVar3,__nmemb,4,Vec_IntSortCompare2);
  if (0 < (long)__nmemb) {
    sVar7 = 0;
    do {
      if ((piVar3[sVar7] < 0) || (p->pGia->nObjs <= piVar3[sVar7])) {
LAB_005f7390:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
      printf("%d ");
      sVar7 = sVar7 + 1;
    } while (__nmemb != sVar7);
  }
  putchar(10);
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Ga2_ManRefinePrintPPis( Ga2_Man_t * p )
{
    Vec_Int_t * vVec = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
    }
    printf( "        Current PPIs (%d): ", Vec_IntSize(vVec) );
    Vec_IntSort( vVec, 1 );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        printf( "%d ", Gia_ObjId(p->pGia, pObj) );
    printf( "\n" );
    Vec_IntFree( vVec );
}